

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-think-dungeon-util.c
# Opt level: O2

_Bool borg_think_stair_scum(_Bool from_town)

{
  uint8_t uVar1;
  loc grid;
  keycode_t k;
  int16_t iVar2;
  int *piVar3;
  _Bool _Var4;
  borg_need bVar5;
  square *psVar7;
  borg_track *pbVar8;
  loc_conflict lVar9;
  wchar_t wVar6;
  loc_conflict lVar10;
  int16_t iVar11;
  uint uVar12;
  wchar_t wVar13;
  wchar_t wVar14;
  uint uVar15;
  ulong uVar16;
  uint8_t uVar17;
  ulong uVar18;
  borg_grid *pbVar19;
  long lVar20;
  long lVar21;
  bool bVar22;
  
  pbVar19 = borg_grids[borg.c.y] + borg.c.x;
  grid.y = borg.c.y;
  grid.x = borg.c.x;
  psVar7 = square(cave,grid);
  uVar1 = psVar7->feat;
  borg_notice(true);
  piVar3 = track_more.y;
  iVar2 = track_more.num;
  iVar11 = track_less.num;
  if ((borg.trait[0x69] == 0) || (borg.trait[0x6c] != 0)) {
    borg_note("# Leaving Scumming Mode. (Town or Weak)");
    borg.lunal_mode = false;
    return false;
  }
  if (borg_items[(int)(~borg.trait[0x9e] + (uint)z_info->pack_size)].iqty != '\0') {
    return false;
  }
  if (uVar1 == '\x05') {
    if (pbVar19->feat != '\x05') {
      pbVar8 = &track_less;
      uVar12 = (uint)track_less.num;
      uVar17 = '\x05';
      uVar15 = 0;
      if (0 < track_less.num) {
        uVar15 = uVar12;
      }
      if ((-1 < track_less.num) && ((int)uVar15 < (int)track_less.size)) {
        track_less.x[uVar12] = borg.c.x;
        track_less.y[uVar12] = borg.c.y;
        goto LAB_00230718;
      }
      goto LAB_00230720;
    }
  }
  else if ((uVar1 == '\x06') && (pbVar19->feat != '\x06')) {
    pbVar8 = &track_more;
    uVar15 = (uint)track_more.num;
    uVar18 = 0;
    uVar16 = 0;
    if (0 < track_more.num) {
      uVar16 = (ulong)uVar15;
    }
    for (; uVar16 != uVar18; uVar18 = uVar18 + 1) {
      if ((track_more.x[uVar18] == borg.c.x) && (track_more.y[uVar18] == borg.c.y)) {
        uVar16 = uVar18 & 0xffffffff;
        break;
      }
    }
    uVar17 = '\x06';
    if (((uint)uVar16 == uVar15) && ((int)(uint)uVar16 < (int)track_more.size)) {
      track_more.x[uVar15] = borg.c.x;
      piVar3[uVar15] = borg.c.y;
      iVar11 = iVar2;
LAB_00230718:
      pbVar8->num = iVar11 + 1;
      uVar17 = uVar1;
    }
LAB_00230720:
    pbVar19->feat = uVar17;
  }
  bVar5 = borg_maintain_light();
  if (bVar5 == BORG_MET_NEED) {
    return true;
  }
  if (bVar5 == BORG_UNMET_NEED) {
    borg_note("# Scum. (need fuel)");
  }
  _Var4 = borg_flow_old(L'\x02');
  if (_Var4) {
    return true;
  }
  _Var4 = borg_flow_take_scum(true,L'\x06');
  if (_Var4) {
    return true;
  }
  borg_note("# Fleeing level. Scumming Mode");
  borg.goal.fleeing = true;
  wVar14 = L'\xffffffff';
  if ((track_more.num != 0) && (((byte)(pbVar19->feat - 5) < 2 || (borg.trait[0x69] < 0x1e)))) {
    if (1 < track_more.num) {
      borg_note("# Scumming Mode: I know of a down stair.");
    }
    wVar14 = L'\xffffffff';
    for (lVar21 = 0; lVar21 < track_more.num; lVar21 = lVar21 + 1) {
      lVar9 = loc(track_more.x[lVar21],track_more.y[lVar21]);
      lVar10.y = borg.c.y;
      lVar10.x = borg.c.x;
      wVar6 = distance(lVar10,lVar9);
      wVar13 = wVar6;
      if (wVar14 < wVar6) {
        wVar13 = wVar14;
      }
      bVar22 = wVar14 == L'\xffffffff';
      wVar14 = wVar13;
      if (bVar22) {
        wVar14 = wVar6;
      }
    }
    if (((wVar14 < L'\b') || (pbVar19->feat == '\x06')) || (borg.trait[0x69] < 0x1e)) {
      borg_note("# Scumming Mode.  Power Diving. ");
      _Var4 = borg_flow_old(L'\a');
      if (_Var4) {
        return true;
      }
      _Var4 = borg_flow_stair_more(7,false,false);
      if (_Var4) {
        return true;
      }
      if (pbVar19->feat == '\x06') {
        k = 0x3e;
        goto LAB_0023085e;
      }
    }
  }
  if (((track_less.num != 0) && (borg.trait[0x69] != 1)) && ((byte)(pbVar19->feat - 5) < 2)) {
    pbVar19 = borg_grids[borg.c.y];
    lVar21 = (long)borg.c.x;
    for (lVar20 = 0; lVar20 < track_less.num; lVar20 = lVar20 + 1) {
      lVar10 = loc(track_less.x[lVar20],track_less.y[lVar20]);
      lVar9.y = borg.c.y;
      lVar9.x = borg.c.x;
      wVar6 = distance(lVar9,lVar10);
      wVar13 = wVar6;
      if (wVar14 < wVar6) {
        wVar13 = wVar14;
      }
      bVar22 = wVar14 == L'\xffffffff';
      wVar14 = wVar13;
      if (bVar22) {
        wVar14 = wVar6;
      }
    }
    if ((wVar14 < L'\b') || (pbVar19[lVar21].feat == '\x05')) {
      borg_note("# Scumming Mode.  Power Climb. ");
      borg.goal.less = true;
      _Var4 = borg_flow_old(L'\a');
      if (_Var4) {
        return true;
      }
      _Var4 = borg_flow_stair_less(7,false);
      if (_Var4) {
        borg_note("# Looking for stairs. Scumming Mode.");
        return true;
      }
      if ((pbVar19[lVar21].feat == '\x05') && ((player->opts).opt[0x20] == false)) {
        k = 0x3c;
LAB_0023085e:
        borg_keypress(k);
        return true;
      }
    }
  }
  if (1 < borg.trait[0x69]) {
    _Var4 = borg_flow_old(L'\a');
    if (_Var4) {
      return true;
    }
    borg_note("# Scumming Mode.  Any Stair. ");
    _Var4 = borg_flow_stair_both(7,true);
    if (_Var4) {
      return true;
    }
  }
  return false;
}

Assistant:

bool borg_think_stair_scum(bool from_town)
{
    int j, b_j = -1;
    int i;

    borg_grid *ag = &borg_grids[borg.c.y][borg.c.x];

    uint8_t feat  = square(cave, borg.c)->feat;

    enum borg_need need;

    /* examine equipment and swaps */
    borg_notice(true);

    /* No scumming mode if starving or in town */
    if (borg.trait[BI_CDEPTH] == 0 || borg.trait[BI_ISWEAK]) {
        borg_note("# Leaving Scumming Mode. (Town or Weak)");
        borg.lunal_mode = false;
        return false;
    }

    /* No scumming if inventory is full.  Require one empty slot */
    if (borg_items[PACK_SLOTS - 1].iqty)
        return false;

    /* if borg is just starting on this level, he may not
     * know that a stair is under him.  Cheat to see if one is
     * there
     */
    if (feat == FEAT_MORE && ag->feat != FEAT_MORE) {

        /* Check for an existing "down stairs" */
        for (i = 0; i < track_more.num; i++) {
            /* We already knew about that one */
            if ((track_more.x[i] == borg.c.x) && (track_more.y[i] == borg.c.y))
                break;
        }

        /* Track the newly discovered "down stairs" */
        if ((i == track_more.num) && (i < track_more.size)) {
            track_more.x[i] = borg.c.x;
            track_more.y[i] = borg.c.y;
            track_more.num++;
        }
        /* tell the array */
        ag->feat = FEAT_MORE;
    }

    if (feat == FEAT_LESS && ag->feat != FEAT_LESS) {

        /* Check for an existing "up stairs" */
        for (i = 0; i < track_less.num; i++) {
            /* We already knew about this one */
            if ((track_less.x[i] == borg.c.x) && (track_less.y[i] == borg.c.y))
                continue;
        }

        /* Track the newly discovered "up stairs" */
        if ((i == track_less.num) && (i < track_less.size)) {
            track_less.x[i] = borg.c.x;
            track_less.y[i] = borg.c.y;
            track_less.num++;
        }

        /* Tell the array */
        ag->feat = FEAT_LESS;
    }

    /** First deal with staying alive **/

    /* Hack -- require light */
    need = borg_maintain_light();
    if (need == BORG_MET_NEED)
        return true;
    else if (need == BORG_UNMET_NEED)
        borg_note("# Scum. (need fuel)");

    /** Track down some interesting gear **/
    /* XXX Should we allow him great flexibility in retrieving loot? (not always
     * safe?)*/
    /* Continue flowing towards objects */
    if (borg_flow_old(GOAL_TAKE))
        return true;

    /* Find a (viewable) object */
    if (borg_flow_take_scum(true, 6))
        return true;

    /*leave level right away. */
    borg_note("# Fleeing level. Scumming Mode");
    borg.goal.fleeing = true;

    /* Scumming Mode - Going down */
    if (track_more.num
        && (ag->feat == FEAT_MORE || ag->feat == FEAT_LESS
            || borg.trait[BI_CDEPTH] < 30)) {
        int y, x;

        if (track_more.num >= 2)
            borg_note("# Scumming Mode: I know of a down stair.");

        /* Check for an existing "down stairs" */
        for (i = 0; i < track_more.num; i++) {
            x = track_more.x[i];
            y = track_more.y[i];

            /* How far is the nearest down stairs */
            j = distance(borg.c, loc(x, y));

            /* skip the far ones */
            if (b_j <= j && b_j != -1)
                continue;

            /* track it */
            b_j = j;
        }

        /* if the downstair is close and path is safe, continue on */
        if (b_j < 8 || ag->feat == FEAT_MORE || borg.trait[BI_CDEPTH] < 30) {
            /* Note */
            borg_note("# Scumming Mode.  Power Diving. ");

            /* Continue leaving the level */
            if (borg_flow_old(GOAL_FLEE))
                return true;

            /* Flow to DownStair */
            if (borg_flow_stair_more(GOAL_FLEE, false, false))
                return true;

            /* if standing on a stair */
            if (ag->feat == FEAT_MORE) {
                /* Take the DownStair */
                borg_keypress('>');

                return true;
            }
        }
    }

    /* Scumming Mode - Going up */
    if (track_less.num && borg.trait[BI_CDEPTH] != 1
        && (ag->feat == FEAT_MORE || ag->feat == FEAT_LESS)) {
        int y, x;

        borg_grid *tmp_ag = &borg_grids[borg.c.y][borg.c.x];

        /* Check for an existing "up stairs" */
        for (i = 0; i < track_less.num; i++) {
            x = track_less.x[i];
            y = track_less.y[i];

            /* How far is the nearest up stairs */
            j = distance(borg.c, loc(x, y));

            /* skip the far ones */
            if (b_j <= j && b_j != -1)
                continue;

            /* track it */
            b_j = j;
        }

        /* if the upstair is close and safe path, continue */
        if (b_j < 8 || tmp_ag->feat == FEAT_LESS) {

            /* Note */
            borg_note("# Scumming Mode.  Power Climb. ");

            /* Set to help borg move better */
            borg.goal.less = true;

            /* Continue leaving the level */
            if (borg_flow_old(GOAL_FLEE))
                return true;

            /* Flow to UpStair */
            if (borg_flow_stair_less(GOAL_FLEE, false)) {
                borg_note("# Looking for stairs. Scumming Mode.");

                /* Success */
                return true;
            }

            if (tmp_ag->feat == FEAT_LESS && !OPT(player, birth_force_descend)) {
                /* Take the Up Stair */
                borg_keypress('<');
                return true;
            }
        }
    }

    /* Special case where the borg is off a stair and there
     * is a monster in LOS.  He could freeze and unhook, or
     * move to the closest stair and risk the run.
     */
    if (borg.trait[BI_CDEPTH] >= 2) {
        /* Continue fleeing to stair */
        if (borg_flow_old(GOAL_FLEE))
            return true;

        /* Note */
        borg_note("# Scumming Mode.  Any Stair. ");

        /* Try to find some stairs */
        if (borg_flow_stair_both(GOAL_FLEE, true))
            return true;
    }

    /* return to normal borg_think_dungeon */
    return false;
}